

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<unsigned_int>::erase
          (RepeatedField<unsigned_int> *this,const_iterator first,const_iterator last)

{
  int iVar1;
  const_iterator puVar2;
  iterator puVar3;
  uint *puVar4;
  size_type first_offset;
  const_iterator last_local;
  const_iterator first_local;
  RepeatedField<unsigned_int> *this_local;
  
  puVar2 = cbegin(this);
  iVar1 = (int)((long)first - (long)puVar2 >> 2);
  if (first != last) {
    puVar2 = cend(this);
    puVar3 = begin(this);
    puVar4 = std::copy<unsigned_int_const*,unsigned_int*>(last,puVar2,puVar3 + iVar1);
    puVar2 = cbegin(this);
    Truncate(this,(int)((long)puVar4 - (long)puVar2 >> 2));
  }
  puVar3 = begin(this);
  return puVar3 + iVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}